

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O3

DdNode * BuildSubsetBdd(DdManager *dd,st__table *pathTable,DdNode *node,AssortedInfo *info,
                       st__table *subsetNodeTable)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  FILE *__s;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DdNode *pDVar8;
  int iVar9;
  ulong uVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  size_t __size;
  char *__ptr;
  DdNode *pDVar13;
  int *key;
  DdNode *pDVar14;
  DdNode *pDVar15;
  int *piVar16;
  int *piVar17;
  NodeDist_t *nodeStat;
  char *entry;
  NodeDist_t *nodeStatNnv;
  NodeDist_t *nodeStatNv;
  uint local_a4;
  char *local_68;
  DdNode *local_60;
  DdNode *local_58;
  int *local_50;
  char *local_48;
  int *local_40;
  int *local_38;
  
  pDVar11 = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (pDVar11->index == 0x7fffffff) {
    return node;
  }
  iVar1 = st__lookup(pathTable,(char *)pDVar11,&local_68);
  if (iVar1 == 0) {
    __s = (FILE *)dd->err;
    __ptr = "Something wrong, node must be in table \n";
    __size = 0x28;
    goto LAB_007eb55a;
  }
  local_60 = (DdNode *)((ulong)node & 1);
  if (local_60 == (DdNode *)0x0) {
    pDVar12 = *(DdNode **)(local_68 + 0x10);
  }
  else {
    pDVar12 = *(DdNode **)(local_68 + 0x18);
  }
  if (pDVar12 != (DdNode *)0x0) {
    return pDVar12;
  }
  pDVar12 = (pDVar11->type).kids.T;
  pDVar14 = (pDVar11->type).kids.E;
  pDVar8 = (DdNode *)((ulong)local_60 ^ (ulong)pDVar12);
  piVar17 = (int *)((ulong)pDVar12 & 0xfffffffffffffffe);
  if (*piVar17 == 0x7fffffff) {
    if ((dd->one == pDVar8) && (info->findShortestPath != 0)) {
      info->findShortestPath = 0;
    }
    piVar17[1] = piVar17[1] + 1;
    piVar17 = (int *)0x0;
    if (local_60 == pDVar12) {
      return (DdNode *)0x0;
    }
    iVar1 = 1;
    uVar3 = 0xffffffff;
    local_a4 = 0;
    pDVar12 = pDVar8;
LAB_007eb684:
    pDVar13 = (DdNode *)((ulong)local_60 ^ (ulong)pDVar14);
    key = (int *)((ulong)pDVar14 & 0xfffffffffffffffe);
    local_58 = node;
    if (*key == 0x7fffffff) {
      if ((dd->one == pDVar13) && (info->findShortestPath != 0)) {
        info->findShortestPath = 0;
      }
      key[1] = key[1] + 1;
      uVar5 = 0;
      if (local_60 == pDVar14) {
        return (DdNode *)0x0;
      }
      uVar6 = 0xffffffff;
      key = (int *)0x0;
      pDVar14 = pDVar13;
      iVar9 = iVar1 + 1;
LAB_007eb76c:
      local_50 = piVar17;
      do {
        pDVar15 = pDVar13;
        piVar16 = key;
        uVar7 = uVar5;
        if (iVar9 == 0) {
          if (local_a4 == uVar5 && uVar3 <= uVar6 || local_a4 < uVar5) {
            iVar1 = 1;
            pDVar15 = pDVar8;
            piVar16 = piVar17;
            uVar7 = local_a4;
          }
        }
        else {
          if (iVar9 == 2) {
            info->findShortestPath = 0;
            uVar3 = Cudd_NodeReadIndex(pDVar11);
            pDVar11 = Cudd_ReadVars(dd,uVar3);
            piVar17 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
            *piVar17 = *piVar17 + 1;
            pDVar8 = cuddBddIteRecur(dd,pDVar11,pDVar12,pDVar14);
            if (pDVar8 != (DdNode *)0x0) {
              piVar17 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar17 = *piVar17 + 1;
            }
            Cudd_RecursiveDeref(dd,pDVar11);
            Cudd_RecursiveDeref(dd,pDVar12);
            Cudd_RecursiveDeref(dd,pDVar14);
            pDVar11 = local_58;
            if (subsetNodeTable != (st__table *)0x0) {
              piVar17 = (int *)((ulong)pDVar8 & 0xfffffffffffffffe);
              iVar1 = st__lookup(subsetNodeTable,(char *)piVar17,&local_48);
              if ((iVar1 == 0) && (*piVar17 != 0x7fffffff)) {
                iVar1 = st__insert(subsetNodeTable,(char *)piVar17,(char *)0x0);
                if (iVar1 == -10000) {
                  fwrite("Out of memory\n",0xe,1,(FILE *)dd->err);
                  return (DdNode *)0x0;
                }
                if (info->threshold < subsetNodeTable->num_entries) {
                  info->thresholdReached = 0;
                }
              }
            }
            if (pDVar8 == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
            uVar10 = (ulong)pDVar8 & 0xfffffffffffffffe;
            if (local_60 == (DdNode *)0x0) {
              *(DdNode **)(local_68 + 0x10) = pDVar8;
              iVar1 = *(int *)(uVar10 + 4) + 1;
              *(int *)(uVar10 + 4) = iVar1;
              if (pDVar8 != pDVar11) goto LAB_007ebb0c;
              if (*(DdNode **)(local_68 + 0x18) != (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,*(DdNode **)(local_68 + 0x18));
                iVar1 = *(int *)(uVar10 + 4);
              }
              *(ulong *)(local_68 + 0x18) = (ulong)pDVar8 ^ 1;
            }
            else {
              *(DdNode **)(local_68 + 0x18) = pDVar8;
              iVar1 = *(int *)(uVar10 + 4) + 1;
              *(int *)(uVar10 + 4) = iVar1;
              if (pDVar8 != pDVar11) goto LAB_007ebb0c;
              if (*(DdNode **)(local_68 + 0x10) != (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,*(DdNode **)(local_68 + 0x10));
                iVar1 = *(int *)(uVar10 + 4);
              }
              *(ulong *)(local_68 + 0x10) = (ulong)pDVar8 ^ 1;
            }
            *(int *)(uVar10 + 4) = iVar1 + 1;
LAB_007ebb0c:
            *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + -1;
            return pDVar8;
          }
          if (iVar1 == 0) {
            uVar7 = local_a4;
            pDVar15 = pDVar8;
            piVar16 = piVar17;
          }
          iVar1 = 1;
        }
        pDVar4 = zero;
        if (uVar7 <= info->maxpath) {
          if (uVar7 < info->maxpath) {
            if (info->findShortestPath != 0) {
              info->findShortestPath = 0;
            }
            pDVar4 = BuildSubsetBdd(dd,pathTable,pDVar15,info,subsetNodeTable);
            piVar17 = local_50;
          }
          else {
            iVar2 = st__lookup(info->maxpathTable,(char *)piVar16,&local_48);
            if (iVar2 == 0) {
              if (info->thresholdReached < 1) {
                pDVar4 = zero;
                if (info->findShortestPath != 0) {
                  iVar2 = st__insert(info->maxpathTable,(char *)piVar16,(char *)0x0);
                  if (iVar2 == -10000) goto LAB_007eb8de;
                  info->thresholdReached = info->thresholdReached + -1;
                  goto LAB_007eb926;
                }
              }
              else {
                iVar2 = st__insert(info->maxpathTable,(char *)piVar16,(char *)0x0);
                if (iVar2 != -10000) {
                  iVar2 = info->thresholdReached;
                  info->thresholdReached = iVar2 + -1;
                  if (iVar2 < 2) {
                    info->findShortestPath = 1;
                  }
                  goto LAB_007eb926;
                }
LAB_007eb8de:
                memOut = 1;
                fwrite("OUT of memory\n",0xe,1,(FILE *)dd->err);
                info->thresholdReached = 0;
                pDVar4 = zero;
              }
            }
            else {
              if (info->findShortestPath != 0) {
                info->findShortestPath = 0;
              }
LAB_007eb926:
              pDVar4 = BuildSubsetBdd(dd,pathTable,pDVar15,info,subsetNodeTable);
            }
          }
        }
        if (pDVar4 == (DdNode *)0x0) {
          if (pDVar12 != (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar12);
          }
          if (pDVar14 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          Cudd_RecursiveDeref(dd,pDVar14);
          return (DdNode *)0x0;
        }
        piVar16 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar16 = *piVar16 + 1;
        if (pDVar15 == pDVar8) {
          pDVar12 = pDVar4;
          pDVar4 = pDVar14;
        }
        pDVar14 = pDVar4;
        iVar9 = iVar9 + 1;
      } while( true );
    }
    iVar9 = st__lookup(pathTable,(char *)key,(char **)&local_40);
    if (iVar9 != 0) {
      uVar7 = 0xffffffff;
      uVar6 = 0xffffffff;
      if ((*local_40 != -1) && (uVar6 = *local_40 + local_40[2], local_40[2] == -1)) {
        uVar6 = 0xffffffff;
      }
      if ((local_40[1] != -1) && (uVar7 = local_40[1] + local_40[3], local_40[3] == -1)) {
        uVar7 = 0xffffffff;
      }
      uVar5 = uVar7;
      if (uVar6 < uVar7) {
        uVar5 = uVar6;
      }
      uVar6 = local_40[(ulong)(uVar7 < uVar6) + 2];
      pDVar14 = (DdNode *)0x0;
      iVar9 = iVar1;
      goto LAB_007eb76c;
    }
  }
  else {
    iVar1 = st__lookup(pathTable,(char *)piVar17,(char **)&local_38);
    if (iVar1 != 0) {
      uVar5 = 0xffffffff;
      uVar3 = 0xffffffff;
      if ((*local_38 != -1) && (uVar3 = *local_38 + local_38[2], local_38[2] == -1)) {
        uVar3 = 0xffffffff;
      }
      if ((local_38[1] != -1) && (uVar5 = local_38[1] + local_38[3], local_38[3] == -1)) {
        uVar5 = 0xffffffff;
      }
      local_a4 = uVar5;
      if (uVar3 < uVar5) {
        local_a4 = uVar3;
      }
      uVar3 = local_38[(ulong)(uVar5 < uVar3) + 2];
      pDVar12 = (DdNode *)0x0;
      iVar1 = 0;
      goto LAB_007eb684;
    }
  }
  __s = (FILE *)dd->err;
  __ptr = "Something wrong, node must be in table\n";
  __size = 0x27;
LAB_007eb55a:
  fwrite(__ptr,__size,1,__s);
  dd->errorCode = CUDD_INTERNAL_ERROR;
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
BuildSubsetBdd(
  DdManager * dd /* DD manager */,
  st__table * pathTable /* path table with path lengths and computed results */,
  DdNode * node /* current node */,
  struct AssortedInfo * info /* assorted information structure */,
  st__table * subsetNodeTable /* table storing computed results */)
{
    DdNode *N, *Nv, *Nnv;
    DdNode *ThenBranch, *ElseBranch, *childBranch;
    DdNode *child, *regChild, *regNnv = NULL, *regNv = NULL;
    NodeDist_t *nodeStatNv, *nodeStat, *nodeStatNnv;
    DdNode *neW, *topv, *regNew;
    char *entry;
    unsigned int topid;
    unsigned int childPathLength, oddLen, evenLen, NnvPathLength = 0, NvPathLength = 0;
    unsigned int NvBotDist, NnvBotDist;
    int tiebreakChild;
    int  processingDone, thenDone, elseDone;


#ifdef DD_DEBUG
    numCalls++;
#endif
    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);
    /* Find node in table. */
    if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
        (void) fprintf(dd->err, "Something wrong, node must be in table \n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }
    /* If the node in the table has been visited, then return the corresponding
    ** Dd. Since a node can become a subset of itself, its
    ** complement (that is te same node reached by a different parity) will
    ** become a superset of the original node and result in some minterms
    ** that were not in the original set. Hence two different results are
    ** maintained, corresponding to the odd and even parities.
    */

    /* If this node is reached with an odd parity, get odd parity results. */
    if (Cudd_IsComplement(node)) {
        if  (nodeStat->compResult != NULL) {
#ifdef DD_DEBUG
            hits++;
#endif
            return(nodeStat->compResult);
        }
    } else {
        /* if this node is reached with an even parity, get even parity
         * results
         */
        if (nodeStat->regResult != NULL) {
#ifdef DD_DEBUG
            hits++;
#endif
            return(nodeStat->regResult);
        }
    }


    /* get children */
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* no child processed */
    processingDone = 0;
    /* then child not processed */
    thenDone = 0;
    ThenBranch = NULL;
    /* else child not processed */
    elseDone = 0;
    ElseBranch = NULL;
    /* if then child constant, branch is the child */
    if (Cudd_IsConstant(Nv)) {
        /*shortest path found */
        if ((Nv == DD_ONE(dd)) && (info->findShortestPath)) {
            info->findShortestPath = 0;
        }

        ThenBranch = Nv;
        cuddRef(ThenBranch);
        if (ThenBranch == NULL) {
            return(NULL);
        }

        thenDone++;
        processingDone++;
        NvBotDist = MAXSHORTINT;
    } else {
        /* Derive regular child for table lookup. */
        regNv = Cudd_Regular(Nv);
        /* Get node data for shortest path length. */
        if (! st__lookup(pathTable, (const char *)regNv, (char **)&nodeStatNv) ) {
            (void) fprintf(dd->err, "Something wrong, node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        /* Derive shortest path length for child. */
        if ((nodeStatNv->oddTopDist != MAXSHORTINT) &&
            (nodeStatNv->oddBotDist != MAXSHORTINT)) {
            oddLen = (nodeStatNv->oddTopDist + nodeStatNv->oddBotDist);
        } else {
            oddLen = MAXSHORTINT;
        }

        if ((nodeStatNv->evenTopDist != MAXSHORTINT) &&
            (nodeStatNv->evenBotDist != MAXSHORTINT)) {
            evenLen = (nodeStatNv->evenTopDist +nodeStatNv->evenBotDist);
        } else {
            evenLen = MAXSHORTINT;
        }

        NvPathLength = (oddLen <= evenLen) ? oddLen : evenLen;
        NvBotDist = (oddLen <= evenLen) ? nodeStatNv->oddBotDist:
                                                   nodeStatNv->evenBotDist;
    }
    /* if else child constant, branch is the child */
    if (Cudd_IsConstant(Nnv)) {
        /*shortest path found */
        if ((Nnv == DD_ONE(dd)) && (info->findShortestPath)) {
            info->findShortestPath = 0;
        }

        ElseBranch = Nnv;
        cuddRef(ElseBranch);
        if (ElseBranch == NULL) {
            return(NULL);
        }

        elseDone++;
        processingDone++;
        NnvBotDist = MAXSHORTINT;
    } else {
        /* Derive regular child for table lookup. */
        regNnv = Cudd_Regular(Nnv);
        /* Get node data for shortest path length. */
        if (! st__lookup(pathTable, (const char *)regNnv, (char **)&nodeStatNnv) ) {
            (void) fprintf(dd->err, "Something wrong, node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        /* Derive shortest path length for child. */
        if ((nodeStatNnv->oddTopDist != MAXSHORTINT) &&
            (nodeStatNnv->oddBotDist != MAXSHORTINT)) {
            oddLen = (nodeStatNnv->oddTopDist + nodeStatNnv->oddBotDist);
        } else {
            oddLen = MAXSHORTINT;
        }

        if ((nodeStatNnv->evenTopDist != MAXSHORTINT) &&
            (nodeStatNnv->evenBotDist != MAXSHORTINT)) {
            evenLen = (nodeStatNnv->evenTopDist +nodeStatNnv->evenBotDist);
        } else {
            evenLen = MAXSHORTINT;
        }

        NnvPathLength = (oddLen <= evenLen) ? oddLen : evenLen;
        NnvBotDist = (oddLen <= evenLen) ? nodeStatNnv->oddBotDist :
                                                   nodeStatNnv->evenBotDist;
    }

    tiebreakChild = (NvBotDist <= NnvBotDist) ? 1 : 0;
    /* while both children not processed */
    while (processingDone != 2) {
        if (!processingDone) {
            /* if no child processed */
            /* pick the child with shortest path length and record which one
             * picked
             */
            if ((NvPathLength < NnvPathLength) ||
                ((NvPathLength == NnvPathLength) && (tiebreakChild == 1))) {
                child = Nv;
                regChild = regNv;
                thenDone = 1;
                childPathLength = NvPathLength;
            } else {
                child = Nnv;
                regChild = regNnv;
                elseDone = 1;
                childPathLength = NnvPathLength;
            } /* then path length less than else path length */
        } else {
            /* if one child processed, process the other */
            if (thenDone) {
                child = Nnv;
                regChild = regNnv;
                elseDone = 1;
                childPathLength = NnvPathLength;
            } else {
                child = Nv;
                regChild = regNv;
                thenDone = 1;
                childPathLength = NvPathLength;
            } /* end of else pick the Then child if ELSE child processed */
        } /* end of else one child has been processed */

        /* ignore (replace with constant 0) all nodes which lie on paths larger
         * than the maximum length of the path required
         */
        if (childPathLength > info->maxpath) {
            /* record nodes visited */
            childBranch = zero;
        } else {
            if (childPathLength < info->maxpath) {
                if (info->findShortestPath) {
                    info->findShortestPath = 0;
                }
                childBranch = BuildSubsetBdd(dd, pathTable, child, info,
                                             subsetNodeTable);

            } else { /* Case: path length of node = maxpath */
                /* If the node labeled with maxpath is found in the
                ** maxpathTable, use it to build the subset BDD.  */
                if ( st__lookup(info->maxpathTable, (char *)regChild,
                              (char **)&entry)) {
                    /* When a node that is already been chosen is hit,
                    ** the quest for a complete path is over.  */
                    if (info->findShortestPath) {
                        info->findShortestPath = 0;
                    }
                    childBranch = BuildSubsetBdd(dd, pathTable, child, info,
                                                 subsetNodeTable);
                } else {
                    /* If node is not found in the maxpathTable and
                    ** the threshold has been reached, then if the
                    ** path needs to be completed, continue. Else
                    ** replace the node with a zero.  */
                    if (info->thresholdReached <= 0) {
                        if (info->findShortestPath) {
                            if ( st__insert(info->maxpathTable, (char *)regChild,
                                          (char *)NIL(char)) == st__OUT_OF_MEM) {
                                memOut = 1;
                                (void) fprintf(dd->err, "OUT of memory\n");
                                info->thresholdReached = 0;
                                childBranch = zero;
                            } else {
                                info->thresholdReached--;
                                childBranch = BuildSubsetBdd(dd, pathTable,
                                                    child, info,subsetNodeTable);
                            }
                        } else { /* not find shortest path, we dont need this
                                    node */
                            childBranch = zero;
                        }
                    } else { /* Threshold hasn't been reached,
                             ** need the node. */
                        if ( st__insert(info->maxpathTable, (char *)regChild,
                                      (char *)NIL(char)) == st__OUT_OF_MEM) {
                            memOut = 1;
                            (void) fprintf(dd->err, "OUT of memory\n");
                            info->thresholdReached = 0;
                            childBranch = zero;
                        } else {
                            info->thresholdReached--;
                            if (info->thresholdReached <= 0) {
                                info->findShortestPath = 1;
                            }
                            childBranch = BuildSubsetBdd(dd, pathTable,
                                                 child, info, subsetNodeTable);

                        } /* end of st__insert successful */
                    } /* end of threshold hasnt been reached yet */
                } /* end of else node not found in maxpath table */
            } /* end of if (path length of node = maxpath) */
        } /* end if !(childPathLength > maxpath) */
        if (childBranch == NULL) {
            /* deref other stuff incase reordering has taken place */
            if (ThenBranch != NULL) {
                Cudd_RecursiveDeref(dd, ThenBranch);
                ThenBranch = NULL;
            }
            if (ElseBranch != NULL) {
                Cudd_RecursiveDeref(dd, ElseBranch);
                ElseBranch = NULL;
            }
            return(NULL);
        }

        cuddRef(childBranch);

        if (child == Nv) {
            ThenBranch = childBranch;
        } else {
            ElseBranch = childBranch;
        }
        processingDone++;

    } /*end of while processing Nv, Nnv */

    info->findShortestPath = 0;
    topid = Cudd_NodeReadIndex(N);
    topv = Cudd_ReadVars(dd, topid);
    cuddRef(topv);
    neW = cuddBddIteRecur(dd, topv, ThenBranch, ElseBranch);
    if (neW != NULL) {
        cuddRef(neW);
    }
    Cudd_RecursiveDeref(dd, topv);
    Cudd_RecursiveDeref(dd, ThenBranch);
    Cudd_RecursiveDeref(dd, ElseBranch);


    /* Hard Limit of threshold has been imposed */
    if (subsetNodeTable != NIL( st__table)) {
        /* check if a new node is created */
        regNew = Cudd_Regular(neW);
        /* subset node table keeps all new nodes that have been created to keep
         * a running count of how many nodes have been built in the subset.
         */
        if (! st__lookup(subsetNodeTable, (char *)regNew, (char **)&entry)) {
            if (!Cudd_IsConstant(regNew)) {
                if ( st__insert(subsetNodeTable, (char *)regNew,
                              (char *)NULL) == st__OUT_OF_MEM) {
                    (void) fprintf(dd->err, "Out of memory\n");
                    return (NULL);
                }
                if ( st__count(subsetNodeTable) > info->threshold) {
                    info->thresholdReached = 0;
                }
            }
        }
    }


    if (neW == NULL) {
        return(NULL);
    } else {
        /*store computed result in regular form*/
        if (Cudd_IsComplement(node)) {
            nodeStat->compResult = neW;
            cuddRef(nodeStat->compResult);
            /* if the new node is the same as the corresponding node in the
             * original bdd then its complement need not be computed as it
             * cannot be larger than the node itself
             */
            if (neW == node) {
#ifdef DD_DEBUG
                thishit++;
#endif
                /* if a result for the node has already been computed, then
                 * it can only be smaller than teh node itself. hence store
                 * the node result in order not to break recombination
                 */
                if (nodeStat->regResult != NULL) {
                    Cudd_RecursiveDeref(dd, nodeStat->regResult);
                }
                nodeStat->regResult = Cudd_Not(neW);
                cuddRef(nodeStat->regResult);
            }

        } else {
            nodeStat->regResult = neW;
            cuddRef(nodeStat->regResult);
            if (neW == node) {
#ifdef DD_DEBUG
                thishit++;
#endif
                if (nodeStat->compResult != NULL) {
                    Cudd_RecursiveDeref(dd, nodeStat->compResult);
                }
                nodeStat->compResult = Cudd_Not(neW);
                cuddRef(nodeStat->compResult);
            }
        }

        cuddDeref(neW);
        return(neW);
    } /* end of else i.e. Subset != NULL */
}